

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

undefined8 __thiscall gvr::PLYElement::toString_abi_cxx11_(PLYElement *this)

{
  ostream *poVar1;
  string *in_RSI;
  undefined8 in_RDI;
  ostringstream s;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  if (*(long *)(in_RSI + 0x20) < 0) {
    poVar1 = std::operator<<((ostream *)local_188,"comment ");
    std::operator<<(poVar1,in_RSI);
  }
  else {
    poVar1 = std::operator<<((ostream *)local_188,"element ");
    poVar1 = std::operator<<(poVar1,in_RSI);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::operator<<(poVar1,*(long *)(in_RSI + 0x20));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string PLYElement::toString() const
{
  std::ostringstream s;

  if (size >= 0)
  {
    s << "element " << name << " " << size;
  }
  else
  {
    s << "comment " << name;
  }

  return s.str();
}